

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase114::run(TestCase114 *this)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  DestructionOrderRecorder *ptrCopy;
  DestructionOrderRecorder *ptrCopy_2;
  DestructionOrderRecorder *ptrCopy_3;
  uint destroyed1;
  uint destroyed3;
  uint destroyed2;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint counter;
  uint local_6c;
  uint local_68;
  uint local_64;
  DebugComparison<unsigned_int_&,_int> local_60;
  undefined4 local_34;
  
  local_34 = 0;
  local_6c = 0;
  local_64 = 0;
  local_68 = 0;
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)&local_34;
  plVar1[1] = (long)&local_6c;
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&local_34;
  plVar2[1] = (long)&local_64;
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)&local_34;
  plVar3[1] = (long)&local_68;
  puVar4 = (undefined8 *)operator_new(0x28);
  puVar4[1] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar4[2] = plVar2;
  puVar4[3] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar4[4] = plVar1;
  *puVar4 = &PTR_disposeImpl_002355a8;
  puVar5 = (undefined8 *)operator_new(0x28);
  puVar5[1] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar5[2] = plVar3;
  puVar5[3] = puVar4;
  puVar5[4] = plVar1;
  *puVar5 = &PTR_disposeImpl_002355a8;
  local_60.result = local_6c == 0;
  local_60.left = &local_6c;
  local_60.right = 0;
  local_60.op.content.ptr = " == ";
  local_60.op.content.size_ = 5;
  if ((!local_60.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x85,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed1 == 0",&local_60);
  }
  local_60.result = local_64 == 0;
  local_60.right = 0;
  local_60.op.content.ptr = " == ";
  local_60.op.content.size_ = 5;
  if ((!local_60.result) && (_::Debug::minSeverity < 3)) {
    local_60.left = &local_64;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x86,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed2 == 0",&local_60);
  }
  local_60.result = local_68 == 0;
  local_60.right = 0;
  local_60.op.content.ptr = " == ";
  local_60.op.content.size_ = 5;
  local_60.left = &local_68;
  if ((!local_60.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x87,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed3 == 0",&local_60);
  }
  (**(code **)*puVar5)(puVar5,plVar1);
  local_60.result = local_6c == 1;
  local_60.left = &local_6c;
  local_60.right = 1;
  local_60.op.content.ptr = " == ";
  local_60.op.content.size_ = 5;
  if ((!local_60.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8b,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",&local_60,local_60.left);
  }
  local_60.result = local_64 == 2;
  local_60.right = 2;
  local_60.op.content.ptr = " == ";
  local_60.op.content.size_ = 5;
  if ((!local_60.result) && (_::Debug::minSeverity < 3)) {
    local_60.left = &local_64;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8c,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",&local_60,&local_64);
  }
  local_60.result = local_68 == 3;
  local_60.right = 3;
  local_60.op.content.ptr = " == ";
  local_60.op.content.size_ = 5;
  if ((!local_60.result) && (_::Debug::minSeverity < 3)) {
    local_60.left = &local_68;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8d,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",&local_60,&local_68);
  }
  return;
}

Assistant:

TEST(Memory, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto ptr = obj1.get();

  Own<DestructionOrderRecorder> combined = obj1.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.get() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}